

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::count_digits<4u>
          (int_writer<unsigned_long,fmt::v5::basic_format_specs<char>> *this)

{
  int num_digits;
  unsigned_type n;
  int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this_local;
  
  n = *(unsigned_type *)(this + 0x10);
  num_digits = 0;
  do {
    num_digits = num_digits + 1;
    n = n >> 4;
  } while (n != 0);
  return num_digits;
}

Assistant:

int count_digits() const {
      unsigned_type n = abs_value;
      int num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }